

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O0

bool anon_unknown.dwarf_8cc60b::ProcessMappedItem
               (IfcMappedItem *mapped,aiNode *nd_src,
               vector<aiNode_*,_std::allocator<aiNode_*>_> *subnodes_src,uint matid,
               ConversionData *conv)

{
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *this;
  bool bVar1;
  bool bVar2;
  uint matid_00;
  aiNode *this_00;
  pointer paVar3;
  IfcCartesianTransformationOperator *op;
  IfcRepresentationMap *pIVar4;
  element_type *in;
  reference this_01;
  uint64_t id;
  IfcRepresentation *pIVar5;
  Lazy *this_02;
  size_type sVar6;
  reference this_03;
  double local_580;
  pointer local_558;
  aiMatrix4x4t<float> local_550;
  aiMatrix4x4t<float> local_510;
  ulong local_4d0;
  size_t i;
  size_t diff;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  format local_458;
  IfcRepresentationItem *local_2e0;
  IfcRepresentationItem *item;
  const_iterator __end1;
  const_iterator __begin1;
  ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_1UL,_0UL> *__range1;
  bool got;
  IfcRepresentation *repr;
  uint localmatid;
  TempOpening *open;
  iterator __end2;
  iterator __begin2;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *__range2;
  IfcMatrix4 minv;
  size_t old_openings;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> meshes;
  undefined1 auStack_150 [8];
  IfcMatrix4 msrc;
  IfcMatrix4 m;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> local_40;
  unique_ptr<aiNode,_std::default_delete<aiNode>_> nd;
  ConversionData *conv_local;
  uint matid_local;
  vector<aiNode_*,_std::allocator<aiNode_*>_> *subnodes_src_local;
  aiNode *nd_src_local;
  IfcMappedItem *mapped_local;
  
  nd._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
  super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
  super__Head_base<0UL,_aiNode_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)
       (__uniq_ptr_data<aiNode,_std::default_delete<aiNode>,_true,_true>)conv;
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  std::unique_ptr<aiNode,std::default_delete<aiNode>>::unique_ptr<std::default_delete<aiNode>,void>
            ((unique_ptr<aiNode,std::default_delete<aiNode>> *)&local_40,this_00);
  paVar3 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_40);
  aiString::Set(&paVar3->mName,"IfcMappedItem");
  aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)&msrc.d4);
  op = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator>::operator*
                 ((Lazy<Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator> *)
                  &(mapped->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).
                   field_0x18);
  Assimp::IFC::ConvertTransformOperator((IfcMatrix4 *)&msrc.d4,op);
  aiMatrix4x4t<double>::aiMatrix4x4t((aiMatrix4x4t<double> *)auStack_150);
  pIVar4 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>::operator->
                     ((Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap> *)
                      &(mapped->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).
                       field_0x10);
  in = std::
       __shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
       ::operator*((__shared_ptr_access<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)&(pIVar4->
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>).
                       field_0x10);
  Assimp::IFC::ConvertAxisPlacement
            ((IfcMatrix4 *)auStack_150,in,
             (ConversionData *)
             nd._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
             super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
             super__Head_base<0UL,_aiNode_*,_false>._M_head_impl);
  aiMatrix4x4t<double>::operator*
            ((aiMatrix4x4t<double> *)&meshes._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (aiMatrix4x4t<double> *)&msrc.d4,(aiMatrix4x4t<double> *)auStack_150);
  memcpy(auStack_150,&meshes._M_t._M_impl.super__Rb_tree_header._M_node_count,0x80);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &old_openings);
  if (*(long *)((long)nd._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x150) == 0) {
    local_580 = 0.0;
  }
  else {
    local_580 = (double)std::
                        vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                        ::size(*(vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                 **)((long)nd._M_t.
                                           super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                           .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl +
                                    0x150));
  }
  minv.d4 = local_580;
  if (*(long *)((long)nd._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                      super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                      super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x148) != 0) {
    minv.d2 = msrc.d2;
    minv.d3 = msrc.d3;
    minv.c4 = msrc.c4;
    minv.d1 = msrc.d1;
    minv.c2 = msrc.c2;
    minv.c3 = msrc.c3;
    minv.b4 = msrc.b4;
    minv.c1 = msrc.c1;
    minv.b2 = msrc.b2;
    minv.b3 = msrc.b3;
    minv.a4 = msrc.a4;
    minv.b1 = msrc.b1;
    minv.a2 = msrc.a2;
    minv.a3 = msrc.a3;
    __range2 = (vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *)
               auStack_150;
    minv.a1 = msrc.a1;
    aiMatrix4x4t<double>::Inverse((aiMatrix4x4t<double> *)&__range2);
    this = *(vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> **)
            ((long)nd._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                   super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                   super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x148);
    __end2 = std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::begin
                       (this);
    open = (TempOpening *)
           std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::end
                     (this);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
                                       *)&open), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
                ::operator*(&__end2);
      Assimp::IFC::TempOpening::Transform(this_01,(IfcMatrix4 *)&__range2);
      __gnu_cxx::
      __normal_iterator<Assimp::IFC::TempOpening_*,_std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>_>
      ::operator++(&__end2);
    }
  }
  id = Assimp::STEP::Object::GetID
                 ((Object *)(&mapped->field_0x0 + *(long *)(*(long *)mapped + -0x18)));
  matid_00 = Assimp::IFC::ProcessMaterials
                       (id,matid,(ConversionData *)
                                 nd._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                                 super__Head_base<0UL,_aiNode_*,_false>._M_head_impl,false);
  pIVar4 = Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap>::operator->
                     ((Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationMap> *)
                      &(mapped->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcMappedItem,_2UL>).
                       field_0x10);
  pIVar5 = Assimp::STEP::Lazy::operator_cast_to_IfcRepresentation_
                     ((Lazy *)&(pIVar4->
                               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationMap,_2UL>
                               ).field_0x20);
  bVar1 = false;
  __end1 = std::
           vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
           ::begin(&(pIVar5->Items).
                    super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
                  );
  item = (IfcRepresentationItem *)
         std::
         vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
         ::end(&(pIVar5->Items).
                super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>
              );
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>_>
                                     *)&item), bVar2) {
    this_02 = (Lazy *)__gnu_cxx::
                      __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>_>
                      ::operator*(&__end1);
    local_2e0 = Assimp::STEP::Lazy::operator_cast_to_IfcRepresentationItem_(this_02);
    bVar2 = Assimp::IFC::ProcessRepresentationItem
                      (local_2e0,matid_00,
                       (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       &old_openings,
                       (ConversionData *)
                       nd._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                       super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                       super__Head_base<0UL,_aiNode_*,_false>._M_head_impl);
    if (bVar2) {
      bVar1 = true;
    }
    else {
      Assimp::STEP::Object::GetClassName_abi_cxx11_
                (&local_4b8,
                 (Object *)
                 ((long)&(local_2e0->
                         super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>).
                         _vptr_ObjectHelper +
                 (long)(local_2e0->
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>).
                       _vptr_ObjectHelper[-3]));
      std::operator+(&local_498,"skipping mapped entity of type ",&local_4b8);
      std::operator+(&local_478,&local_498,", no representations could be generated");
      Assimp::Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
      basic_formatter<std::__cxx11::string>
                ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)&local_458,
                 &local_478);
      Assimp::LogFunctions<Assimp::IFCImporter>::LogWarn(&local_458);
      Assimp::Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_458);
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_498);
      std::__cxx11::string::~string((string *)&local_4b8);
    }
    __gnu_cxx::
    __normal_iterator<const_Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_*,_std::vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcRepresentationItem>_>_>_>
    ::operator++(&__end1);
  }
  if (bVar1) {
    paVar3 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::get(&local_40);
    Assimp::IFC::AssignAddedMeshes
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               &old_openings,paVar3,
               (ConversionData *)
               nd._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
               super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
               super__Head_base<0UL,_aiNode_*,_false>._M_head_impl);
    if (*(long *)((long)nd._M_t.super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>._M_t.
                        super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                        super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x150) != 0) {
      sVar6 = std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>::size
                        (*(vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                           **)((long)nd._M_t.
                                     super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>.
                                     _M_t.
                                     super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>.
                                     super__Head_base<0UL,_aiNode_*,_false>._M_head_impl + 0x150));
      i = sVar6 - (long)minv.d4;
      if (i != 0) {
        for (local_4d0 = 0; local_4d0 < i; local_4d0 = local_4d0 + 1) {
          this_03 = std::vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                    ::operator[](*(vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_>
                                   **)((long)nd._M_t.
                                             super___uniq_ptr_impl<aiNode,_std::default_delete<aiNode>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_aiNode_*,_std::default_delete<aiNode>_>
                                             .super__Head_base<0UL,_aiNode_*,_false>._M_head_impl +
                                      0x150),(long)minv.d4 + local_4d0);
          Assimp::IFC::TempOpening::Transform(this_03,(IfcMatrix4 *)auStack_150);
        }
      }
    }
    aiMatrix4x4t::operator_cast_to_aiMatrix4x4t(&local_550,(aiMatrix4x4t *)auStack_150);
    aiMatrix4x4t<float>::operator*(&local_510,&nd_src->mTransformation,&local_550);
    paVar3 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::operator->(&local_40);
    (paVar3->mTransformation).d1 = local_510.d1;
    (paVar3->mTransformation).d2 = local_510.d2;
    (paVar3->mTransformation).d3 = local_510.d3;
    (paVar3->mTransformation).d4 = local_510.d4;
    (paVar3->mTransformation).c1 = local_510.c1;
    (paVar3->mTransformation).c2 = local_510.c2;
    (paVar3->mTransformation).c3 = local_510.c3;
    (paVar3->mTransformation).c4 = local_510.c4;
    (paVar3->mTransformation).b1 = local_510.b1;
    (paVar3->mTransformation).b2 = local_510.b2;
    (paVar3->mTransformation).b3 = local_510.b3;
    (paVar3->mTransformation).b4 = local_510.b4;
    (paVar3->mTransformation).a1 = local_510.a1;
    (paVar3->mTransformation).a2 = local_510.a2;
    (paVar3->mTransformation).a3 = local_510.a3;
    (paVar3->mTransformation).a4 = local_510.a4;
    local_558 = std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::release(&local_40);
    std::vector<aiNode_*,_std::allocator<aiNode_*>_>::push_back(subnodes_src,&local_558);
    mapped_local._7_1_ = true;
  }
  else {
    mapped_local._7_1_ = false;
  }
  diff._4_4_ = 1;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &old_openings);
  std::unique_ptr<aiNode,_std::default_delete<aiNode>_>::~unique_ptr(&local_40);
  return mapped_local._7_1_;
}

Assistant:

bool ProcessMappedItem(const Schema_2x3::IfcMappedItem& mapped, aiNode* nd_src, std::vector< aiNode* >& subnodes_src, unsigned int matid, ConversionData& conv)
{
    // insert a custom node here, the carthesian transform operator is simply a conventional transformation matrix
    std::unique_ptr<aiNode> nd(new aiNode());
    nd->mName.Set("IfcMappedItem");

    // handle the Cartesian operator
    IfcMatrix4 m;
    ConvertTransformOperator(m, *mapped.MappingTarget);

    IfcMatrix4 msrc;
    ConvertAxisPlacement(msrc,*mapped.MappingSource->MappingOrigin,conv);

    msrc = m*msrc;

    std::set<unsigned int> meshes;
    const size_t old_openings = conv.collect_openings ? conv.collect_openings->size() : 0;
    if (conv.apply_openings) {
        IfcMatrix4 minv = msrc;
        minv.Inverse();
        for(TempOpening& open :*conv.apply_openings){
            open.Transform(minv);
        }
    }

    unsigned int localmatid = ProcessMaterials(mapped.GetID(),matid,conv,false);
    const Schema_2x3::IfcRepresentation& repr = mapped.MappingSource->MappedRepresentation;

    bool got = false;
    for(const Schema_2x3::IfcRepresentationItem& item : repr.Items) {
        if(!ProcessRepresentationItem(item,localmatid,meshes,conv)) {
            IFCImporter::LogWarn("skipping mapped entity of type " + item.GetClassName() + ", no representations could be generated");
        }
        else got = true;
    }

    if (!got) {
        return false;
    }

    AssignAddedMeshes(meshes,nd.get(),conv);
    if (conv.collect_openings) {

        // if this pass serves us only to collect opening geometry,
        // make sure we transform the TempMesh's which we need to
        // preserve as well.
        if(const size_t diff = conv.collect_openings->size() - old_openings) {
            for(size_t i = 0; i < diff; ++i) {
                (*conv.collect_openings)[old_openings+i].Transform(msrc);
            }
        }
    }

    nd->mTransformation =  nd_src->mTransformation * static_cast<aiMatrix4x4>( msrc );
    subnodes_src.push_back(nd.release());

    return true;
}